

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexArrayTest.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Functional::SingleVertexArrayStrideGroup::init
          (SingleVertexArrayStrideGroup *this,EVP_PKEY_CTX *ctx)

{
  pointer *ppAVar1;
  Storage storage_;
  GLValue max_;
  int iVar2;
  int iVar3;
  undefined8 in_RAX;
  long *plVar4;
  undefined8 *puVar5;
  MultiVertexArrayTest *this_00;
  undefined8 uVar6;
  ulong uVar7;
  ulong *puVar8;
  int **ppiVar9;
  Storage extraout_EDX;
  Storage extraout_EDX_00;
  Storage storage;
  InputType IVar10;
  int *piVar11;
  long lVar12;
  bool bVar13;
  GLValue GVar14;
  Spec spec;
  string name;
  ArraySpec arraySpec;
  uint local_1e4;
  undefined1 local_1d8 [16];
  pointer local_1c8;
  pointer pAStack_1c0;
  pointer local_1b8;
  long *local_1b0;
  undefined8 local_1a8;
  long local_1a0;
  undefined8 uStack_198;
  long *local_190;
  undefined8 local_188;
  long local_180;
  undefined8 uStack_178;
  ulong *local_170;
  long local_168;
  ulong local_160;
  long lStack_158;
  ulong *local_150;
  long local_148;
  ulong local_140;
  long lStack_138;
  uint local_130;
  uint local_12c;
  long local_128;
  ulong local_120;
  long local_118;
  string local_110;
  string local_f0;
  string local_d0;
  undefined1 local_b0 [16];
  int *local_a0;
  long lStack_98;
  string local_70;
  InputType local_50;
  undefined4 uStack_4c;
  anon_union_8_10_1f5805e9_for_GLValue_1 aStack_48;
  InputType local_40;
  undefined4 uStack_3c;
  anon_union_8_10_1f5805e9_for_GLValue_1 aStack_38;
  
  uVar7 = CONCAT71((int7)((ulong)in_RAX >> 8),1);
  local_120 = 0;
  local_128 = 0;
  do {
    local_130 = (uint)uVar7;
    local_1e4 = 2;
    do {
      uVar6 = CONCAT71((int7)(uVar7 >> 8),1);
      local_118 = 0;
      do {
        local_12c = (uint)uVar6;
        lVar12 = 0;
        do {
          IVar10 = this->m_type;
          if (lVar12 == 0) {
            iVar2 = 0x10;
            if ((IVar10 & ~INPUTTYPE_FIXED) != INPUTTYPE_UNSIGNED_INT_2_10_10_10) {
              iVar2 = deqp::gls::Array::inputTypeSize(IVar10);
              iVar2 = iVar2 * local_1e4;
              IVar10 = this->m_type;
              goto LAB_01174005;
            }
LAB_01173fe1:
            iVar3 = deqp::gls::Array::inputTypeSize(IVar10);
            iVar3 = iVar3 * local_1e4;
            storage = extraout_EDX;
          }
          else {
            iVar2 = *(int *)((long)&DAT_01bfd070 + lVar12);
            if ((IVar10 & ~INPUTTYPE_FIXED) == INPUTTYPE_UNSIGNED_INT_2_10_10_10) goto LAB_01173fe1;
LAB_01174005:
            iVar3 = deqp::gls::Array::inputTypeSize(IVar10);
            storage = extraout_EDX_00;
          }
          if ((local_120 & 1) == 0) {
            bVar13 = false;
          }
          else {
            storage = iVar2 % iVar3;
            bVar13 = storage != STORAGE_USER;
          }
          storage_ = deqp::gles2::Functional::UniformCase::randomFeatures(unsigned_int)::
                     arrayUsageChoices[local_128];
          deqp::gls::Array::storageToString_abi_cxx11_(&local_70,(Array *)(ulong)storage_,storage);
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_70);
          local_170 = &local_160;
          puVar8 = (ulong *)(plVar4 + 2);
          if ((ulong *)*plVar4 == puVar8) {
            local_160 = *puVar8;
            lStack_158 = plVar4[3];
          }
          else {
            local_160 = *puVar8;
            local_170 = (ulong *)*plVar4;
          }
          local_168 = plVar4[1];
          *plVar4 = (long)puVar8;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          typeToString<int>(&local_d0,iVar2);
          uVar7 = 0xf;
          if (local_170 != &local_160) {
            uVar7 = local_160;
          }
          if (uVar7 < local_d0._M_string_length + local_168) {
            uVar6 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
              uVar6 = local_d0.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar6 < local_d0._M_string_length + local_168) goto LAB_01174121;
            puVar5 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_170);
          }
          else {
LAB_01174121:
            puVar5 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_170,(ulong)local_d0._M_dataplus._M_p);
          }
          local_1b0 = &local_1a0;
          plVar4 = puVar5 + 2;
          if ((long *)*puVar5 == plVar4) {
            local_1a0 = *plVar4;
            uStack_198 = puVar5[3];
          }
          else {
            local_1a0 = *plVar4;
            local_1b0 = (long *)*puVar5;
          }
          local_1a8 = puVar5[1];
          *puVar5 = plVar4;
          puVar5[1] = 0;
          *(undefined1 *)plVar4 = 0;
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_1b0);
          local_150 = &local_140;
          puVar8 = (ulong *)(plVar4 + 2);
          if ((ulong *)*plVar4 == puVar8) {
            local_140 = *puVar8;
            lStack_138 = plVar4[3];
          }
          else {
            local_140 = *puVar8;
            local_150 = (ulong *)*plVar4;
          }
          local_148 = plVar4[1];
          *plVar4 = (long)puVar8;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          typeToString<int>(&local_f0,local_1e4);
          uVar7 = 0xf;
          if (local_150 != &local_140) {
            uVar7 = local_140;
          }
          if (uVar7 < local_f0._M_string_length + local_148) {
            uVar6 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
              uVar6 = local_f0.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar6 < local_f0._M_string_length + local_148) goto LAB_0117426b;
            puVar5 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_150);
          }
          else {
LAB_0117426b:
            puVar5 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_150,(ulong)local_f0._M_dataplus._M_p);
          }
          local_1d8._0_8_ = &local_1c8;
          ppAVar1 = (pointer *)(puVar5 + 2);
          if ((pointer *)*puVar5 == ppAVar1) {
            local_1c8 = *ppAVar1;
            pAStack_1c0 = (pointer)puVar5[3];
          }
          else {
            local_1c8 = *ppAVar1;
            local_1d8._0_8_ = (pointer *)*puVar5;
          }
          local_1d8._8_8_ = puVar5[1];
          *puVar5 = ppAVar1;
          puVar5[1] = 0;
          *(undefined1 *)ppAVar1 = 0;
          plVar4 = (long *)std::__cxx11::string::append(local_1d8);
          local_b0._0_8_ = &local_a0;
          ppiVar9 = (int **)(plVar4 + 2);
          if ((int **)*plVar4 == ppiVar9) {
            local_a0 = *ppiVar9;
            lStack_98 = plVar4[3];
          }
          else {
            local_a0 = *ppiVar9;
            local_b0._0_8_ = (int **)*plVar4;
          }
          local_b0._8_8_ = plVar4[1];
          *plVar4 = (long)ppiVar9;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          iVar3 = (&DAT_01bcc010)[local_118];
          typeToString<int>(&local_110,iVar3);
          piVar11 = (int *)0xf;
          if ((int **)local_b0._0_8_ != &local_a0) {
            piVar11 = local_a0;
          }
          if (piVar11 < (int *)(local_110._M_string_length + local_b0._8_8_)) {
            uVar6 = (int *)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_110._M_dataplus._M_p != &local_110.field_2) {
              uVar6 = local_110.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar6 < (int *)(local_110._M_string_length + local_b0._8_8_))
            goto LAB_011743be;
            puVar5 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,local_b0._0_8_);
          }
          else {
LAB_011743be:
            puVar5 = (undefined8 *)
                     std::__cxx11::string::_M_append(local_b0,(ulong)local_110._M_dataplus._M_p);
          }
          local_190 = &local_180;
          plVar4 = puVar5 + 2;
          if ((long *)*puVar5 == plVar4) {
            local_180 = *plVar4;
            uStack_178 = puVar5[3];
          }
          else {
            local_180 = *plVar4;
            local_190 = (long *)*puVar5;
          }
          local_188 = puVar5[1];
          *puVar5 = plVar4;
          puVar5[1] = 0;
          *(undefined1 *)plVar4 = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) {
            operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
          }
          if ((int **)local_b0._0_8_ != &local_a0) {
            operator_delete((void *)local_b0._0_8_,(long)local_a0 + 1);
          }
          if ((pointer *)local_1d8._0_8_ != &local_1c8) {
            operator_delete((void *)local_1d8._0_8_,(ulong)((long)&local_1c8->inputType + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
          }
          if (local_150 != &local_140) {
            operator_delete(local_150,local_140 + 1);
          }
          if (local_1b0 != &local_1a0) {
            operator_delete(local_1b0,local_1a0 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
          }
          if (local_170 != &local_160) {
            operator_delete(local_170,local_160 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
          IVar10 = this->m_type;
          if (IVar10 == INPUTTYPE_UNSIGNED_INT_2_10_10_10) {
            if (local_1e4 == 4) {
LAB_011745a5:
              GVar14 = deqp::gls::GLValue::getMinValue(IVar10);
              aStack_38 = GVar14.field_1;
              local_40 = GVar14.type;
              GVar14 = deqp::gls::GLValue::getMaxValue(this->m_type);
              aStack_48 = GVar14.field_1;
              local_50 = GVar14.type;
              max_._4_4_ = uStack_4c;
              max_.type = local_50;
              GVar14._4_4_ = uStack_3c;
              GVar14.type = local_40;
              GVar14.field_1 = aStack_38;
              max_.field_1 = aStack_48;
              deqp::gls::MultiVertexArrayTest::Spec::ArraySpec::ArraySpec
                        ((ArraySpec *)local_b0,IVar10,OUTPUTTYPE_VEC4,storage_,USAGE_DYNAMIC_DRAW,
                         local_1e4,0,iVar2,false,GVar14,max_);
              local_1c8 = (pointer)0x0;
              pAStack_1c0 = (pointer)0x0;
              local_1b8 = (pointer)0x0;
              local_1d8._4_4_ = iVar3;
              local_1d8._0_4_ = 1;
              local_1d8._8_8_ = local_1d8._8_8_ & 0xffffffff00000000;
              std::
              vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>>
              ::_M_realloc_insert<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec_const&>
                        ((vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>>
                          *)&local_1c8,(iterator)0x0,(ArraySpec *)local_b0);
              if (!bVar13) {
                this_00 = (MultiVertexArrayTest *)operator_new(0xe0);
                deqp::gls::MultiVertexArrayTest::MultiVertexArrayTest
                          (this_00,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.
                                   m_testCtx,((this->super_TestCaseGroup).m_context)->m_renderCtx,
                           (Spec *)local_1d8,(char *)local_190,(char *)local_190);
                tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
              }
              if (local_1c8 != (pointer)0x0) {
                operator_delete(local_1c8,(long)local_1b8 - (long)local_1c8);
              }
            }
          }
          else if (local_1e4 == 4 || IVar10 != INPUTTYPE_INT_2_10_10_10) goto LAB_011745a5;
          if (local_190 != &local_180) {
            operator_delete(local_190,local_180 + 1);
          }
          lVar12 = lVar12 + 4;
        } while (lVar12 != 0xc);
        local_118 = 1;
        uVar6 = 0;
      } while ((local_12c & 1) != 0);
      local_1e4 = local_1e4 + 1;
      uVar7 = (ulong)local_1e4;
    } while (local_1e4 != 5);
    local_128 = 1;
    local_120 = 1;
    uVar7 = 0;
    if ((local_130 & 1) == 0) {
      return 0;
    }
  } while( true );
}

Assistant:

void SingleVertexArrayStrideGroup::init (void)
{
	Array::Storage		storages[]		= {Array::STORAGE_USER, Array::STORAGE_BUFFER};
	int					counts[]		= {1, 256};
	int					strides[]		= {/*0,*/ -1, 17, 32}; // Tread negative value as sizeof input. Same as 0, but done outside of GL.

	for (int storageNdx = 0; storageNdx < DE_LENGTH_OF_ARRAY(storages); storageNdx++)
	{
		for (int componentCount = 2; componentCount < 5; componentCount++)
		{
			for (int countNdx = 0; countNdx < DE_LENGTH_OF_ARRAY(counts); countNdx++)
			{
				for (int strideNdx = 0; strideNdx < DE_LENGTH_OF_ARRAY(strides); strideNdx++)
				{
					const bool	packed			= m_type == Array::INPUTTYPE_UNSIGNED_INT_2_10_10_10 || m_type == Array::INPUTTYPE_INT_2_10_10_10;
					const int	stride			= (strides[strideNdx] < 0) ? ((packed) ? (16) : (Array::inputTypeSize(m_type) * componentCount)) : (strides[strideNdx]);
					const int	alignment		= (packed) ? (Array::inputTypeSize(m_type) * componentCount) : (Array::inputTypeSize(m_type));
					const bool	bufferUnaligned	= (storages[storageNdx] == Array::STORAGE_BUFFER) && (stride % alignment) != 0;

					std::string name = Array::storageToString(storages[storageNdx]) + "_stride" + typeToString(stride) + "_components" + typeToString(componentCount) + "_quads" + typeToString(counts[countNdx]);

					if((m_type == Array::INPUTTYPE_UNSIGNED_INT_2_10_10_10 || m_type == Array::INPUTTYPE_INT_2_10_10_10) && componentCount != 4)
						continue;

					MultiVertexArrayTest::Spec::ArraySpec arraySpec(m_type,
																	Array::OUTPUTTYPE_VEC4,
																	storages[storageNdx],
																	Array::USAGE_DYNAMIC_DRAW,
																	componentCount,
																	0,
																	stride,
																	false,
																	GLValue::getMinValue(m_type),
																	GLValue::getMaxValue(m_type));

					MultiVertexArrayTest::Spec spec;
					spec.primitive	= Array::PRIMITIVE_TRIANGLES;
					spec.drawCount	= counts[countNdx];
					spec.first		= 0;
					spec.arrays.push_back(arraySpec);

					if (!bufferUnaligned)
						addChild(new MultiVertexArrayTest(m_testCtx, m_context.getRenderContext(), spec, name.c_str(), name.c_str()));
				}
			}
		}
	}
}